

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O0

void serial_worker(void *data)

{
  int iVar1;
  undefined4 local_1c;
  uint i;
  uv_barrier_t *barrier;
  void *data_local;
  
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    uv_barrier_wait(data);
  }
  iVar1 = uv_barrier_wait(data);
  if (0 < iVar1) {
    uv_barrier_destroy(data);
  }
  uv_sleep(100);
  return;
}

Assistant:

static void serial_worker(void* data) {
  uv_barrier_t* barrier;
  unsigned i;

  barrier = data;
  for (i = 0; i < 5; i++)
    uv_barrier_wait(barrier);
  if (uv_barrier_wait(barrier) > 0)
    uv_barrier_destroy(barrier);

  uv_sleep(100);  /* Wait a bit before terminating. */
}